

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

MIR_item_t_conflict
new_func_arr(MIR_context_t ctx,char *name,size_t nres,MIR_type_t *res_types,size_t nargs,
            int vararg_p,MIR_var_t *vars)

{
  MIR_type_t *pMVar1;
  MIR_type_t MVar2;
  MIR_reg_t MVar3;
  size_t i;
  MIR_item_t_conflict item;
  MIR_func_t func;
  size_t sVar4;
  MIR_item_t_conflict pMVar5;
  _func_void_size_t_void_ptr *free_func;
  VARR_reg_desc_t *varr;
  reg_desc_t *prVar6;
  char *extraout_RDX;
  MIR_var_t *unaff_RBX;
  MIR_type_t *unaff_RBP;
  char *pcVar7;
  MIR_error_type_t MVar8;
  size_t sVar9;
  int iVar10;
  MIR_type_t type;
  undefined4 in_register_0000008c;
  void *arg;
  size_t unaff_R15;
  ulong uVar11;
  char **name_ptr;
  char *stored_name;
  
  arg = (void *)CONCAT44(in_register_0000008c,vararg_p);
  if (ctx->curr_func == (MIR_func_t)0x0) {
    if (nargs == 0 && vararg_p != 0) {
      pcVar7 = "Variable arg function %s w/o any mandatory argument";
      MVar8 = MIR_vararg_func_error;
      vars = unaff_RBX;
    }
    else {
      sVar4 = 0;
      do {
        sVar9 = nargs;
        if (nres == sVar4) goto LAB_00110f44;
        pMVar1 = res_types + sVar4;
        sVar4 = sVar4 + 1;
      } while (*pMVar1 < MIR_T_BLK);
      pcVar7 = "wrong result type in func %s";
      MVar8 = MIR_wrong_type_error;
    }
  }
  else {
    name = ctx->curr_func->name;
    pcVar7 = "Creating function when previous function %s is not finished";
    MVar8 = MIR_nested_func_error;
    vars = unaff_RBX;
    res_types = unaff_RBP;
    nres = unaff_R15;
  }
  while( true ) {
    (*ctx->error_func)(MVar8,pcVar7,name);
    name = extraout_RDX;
    sVar9 = nargs;
LAB_00110f44:
    iVar10 = (int)arg;
    nargs = sVar9;
    item = create_item(ctx,MIR_func_item,"function");
    func = (MIR_func_t)malloc(nres * 4 + 0x88);
    (item->u).func = func;
    ctx->curr_func = func;
    if (func != (MIR_func_t)0x0) break;
    free(item);
    pcVar7 = "Not enough memory for creation of func %s";
    MVar8 = MIR_alloc_error;
  }
  pcVar7 = get_ctx_str(ctx,name);
  func->name = pcVar7;
  func->func_item = item;
  func->nres = (uint32_t)nres;
  func->res_types = (MIR_type_t *)(func + 1);
  for (sVar4 = 0; nres != sVar4; sVar4 = sVar4 + 1) {
    *(MIR_type_t *)((long)&func[1].name + sVar4 * 4) = res_types[sVar4];
  }
  pMVar5 = add_item(ctx,item);
  if (pMVar5 != item) {
    __assert_fail("tab_item == func_item",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x569,
                  "MIR_item_t new_func_arr(MIR_context_t, const char *, size_t, MIR_type_t *, size_t, int, MIR_var_t *)"
                 );
  }
  (func->insns).head = (MIR_insn_t_conflict)0x0;
  (func->insns).tail = (MIR_insn_t_conflict)0x0;
  (func->original_insns).head = (MIR_insn_t_conflict)0x0;
  (func->original_insns).tail = (MIR_insn_t_conflict)0x0;
  VARR_MIR_var_tcreate(&func->vars,sVar9 + 8);
  func->global_vars = (VARR_MIR_var_t *)0x0;
  func->last_temp_num = 0;
  func->n_inlines = 0;
  func->nargs = (uint32_t)sVar9;
  func->vararg_p = iVar10 != 0;
  func->expr_p = '\0';
  func->jret_p = '\0';
  func->first_lref = (MIR_lref_data *)0x0;
  free_func = (_func_void_size_t_void_ptr *)malloc(0x20);
  func->machine_code = (void *)0x0;
  func->call_addr = (void *)0x0;
  func->internal = free_func;
  if (free_func == (_func_void_size_t_void_ptr *)0x0) {
    pcVar7 = (char *)0x3;
    (*ctx->error_func)(MIR_alloc_error,"Not enough memory for func regs info");
  }
  else {
    pcVar7 = &DAT_00000018;
    varr = (VARR_reg_desc_t *)malloc(0x18);
    *(VARR_reg_desc_t **)free_func = varr;
    if (varr != (VARR_reg_desc_t *)0x0) {
      varr->els_num = 0;
      varr->size = 0x32;
      prVar6 = (reg_desc_t *)malloc(0x4b0);
      varr->varr = prVar6;
      name_ptr = (char **)0x0;
      VARR_reg_desc_tpush(varr,(reg_desc_t)ZEXT824(6));
      HTAB_size_t_create((HTAB_size_t **)(free_func + 8),100,name2rdn_hash,name2rdn_eq,free_func,arg
                        );
      HTAB_size_t_create((HTAB_size_t **)(free_func + 0x10),10,hrn2rdn_hash,hrn2rdn_eq,free_func,arg
                        );
      HTAB_size_t_create((HTAB_size_t **)(free_func + 0x18),100,reg2rdn_hash,reg2rdn_eq,free_func,
                         arg);
      uVar11 = 1;
      while( true ) {
        if (uVar11 - sVar9 == 1) {
          return item;
        }
        MVar2 = vars->type;
        type = MIR_T_I64;
        if ((MVar2 & ~MIR_T_U8) == MIR_T_F) {
          type = MVar2;
        }
        if (MVar2 == MIR_T_LD) {
          type = MVar2;
        }
        MVar3 = create_func_reg(ctx,func,vars->name,(char *)0x0,(MIR_reg_t)uVar11,type,
                                (int)&stored_name,name_ptr);
        if (uVar11 != MVar3) break;
        vars->name = stored_name;
        name_ptr = (char **)vars->name;
        VARR_MIR_var_tpush(func->vars,*vars);
        uVar11 = uVar11 + 1;
        vars = vars + 1;
      }
      __assert_fail("i + 1 == reg",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x57d,
                    "MIR_item_t new_func_arr(MIR_context_t, const char *, size_t, MIR_type_t *, size_t, int, MIR_var_t *)"
                   );
    }
  }
  mir_varr_error(pcVar7);
}

Assistant:

static MIR_item_t new_func_arr (MIR_context_t ctx, const char *name, size_t nres,
                                MIR_type_t *res_types, size_t nargs, int vararg_p,
                                MIR_var_t *vars) {
  MIR_item_t func_item, tab_item;
  MIR_func_t func;

  if (curr_func != NULL)
    MIR_get_error_func (ctx) (MIR_nested_func_error,
                              "Creating function when previous function %s is not finished",
                              curr_func->name);
  if (nargs == 0 && vararg_p)
    MIR_get_error_func (ctx) (MIR_vararg_func_error,
                              "Variable arg function %s w/o any mandatory argument", name);
  for (size_t i = 0; i < nres; i++)
    if (wrong_type_p (res_types[i]))
      MIR_get_error_func (ctx) (MIR_wrong_type_error, "wrong result type in func %s", name);
  func_item = create_item (ctx, MIR_func_item, "function");
  curr_func = func_item->u.func = func
    = malloc (sizeof (struct MIR_func) + nres * sizeof (MIR_type_t));
  if (func == NULL) {
    free (func_item);
    MIR_get_error_func (ctx) (MIR_alloc_error, "Not enough memory for creation of func %s", name);
  }
  func->name = get_ctx_str (ctx, name);
  func->func_item = func_item;
  func->nres = (uint32_t) nres;
  func->res_types = (MIR_type_t *) ((char *) func + sizeof (struct MIR_func));
  for (size_t i = 0; i < nres; i++) func->res_types[i] = canon_type (res_types[i]);
  tab_item = add_item (ctx, func_item);
  mir_assert (tab_item == func_item);
  DLIST_INIT (MIR_insn_t, func->insns);
  DLIST_INIT (MIR_insn_t, func->original_insns);
  VARR_CREATE (MIR_var_t, func->vars, nargs + 8);
  func->global_vars = NULL;
  func->nargs = (uint32_t) nargs;
  func->last_temp_num = 0;
  func->vararg_p = vararg_p != 0;
  func->expr_p = func->jret_p = FALSE;
  func->n_inlines = 0;
  func->machine_code = func->call_addr = NULL;
  func->first_lref = NULL;
  func_regs_init (ctx, func);
  for (size_t i = 0; i < nargs; i++) {
    char *stored_name;
    MIR_type_t type = canon_type (vars[i].type);
    MIR_reg_t reg
      = create_func_reg (ctx, func, vars[i].name, NULL, (MIR_reg_t) (i + 1),
                         type == MIR_T_F || type == MIR_T_D || type == MIR_T_LD ? type : MIR_T_I64,
                         FALSE, &stored_name);
    mir_assert (i + 1 == reg);
    vars[i].name = stored_name;
    VARR_PUSH (MIR_var_t, func->vars, vars[i]);
  }
  return func_item;
}